

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Writer.cpp
# Opt level: O3

int __thiscall ZXing::OneD::ComputeChecksumIndex(OneD *this,string *contents,int maxWeight)

{
  bool bVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  if ((int)(uint)contents < 1) {
    iVar3 = 0;
  }
  else {
    uVar5 = (ulong)((uint)contents & 0x7fffffff) + 1;
    iVar3 = 0;
    iVar4 = 1;
    do {
      pvVar2 = memchr("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*",(int)(char)this[uVar5 - 2],
                      0x31);
      iVar3 = iVar3 + (-(uint)(pvVar2 == (void *)0x0) | (int)pvVar2 - 0x197710U) * iVar4;
      bVar1 = maxWeight <= iVar4;
      iVar4 = iVar4 + 1;
      if (bVar1) {
        iVar4 = 1;
      }
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    iVar3 = iVar3 % 0x2f;
  }
  return iVar3;
}

Assistant:

static int ComputeChecksumIndex(const std::string& contents, int maxWeight)
{
	int weight = 1;
	int total = 0;

	for (int i = Size(contents) - 1; i >= 0; i--) {
		int indexInString = IndexOf(ALPHABET, contents[i]);
		total += indexInString * weight;
		if (++weight > maxWeight) {
			weight = 1;
		}
	}
	return total % 47;
}